

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::SInt32Size(RepeatedField<int> *value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  
  uVar1 = value->current_size_;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    iVar3 = *(int *)((long)value->arena_or_elements_ + uVar4 * 4);
    uVar2 = iVar3 >> 0x1f ^ iVar3 * 2;
    auVar6._0_4_ = -(uint)(-0x7fffff81 < (int)(uVar2 ^ 0x80000000));
    auVar6._4_4_ = -(uint)(-0x7fffc001 < (int)(uVar2 ^ 0x80000000));
    auVar6._8_4_ = -(uint)(-0x7fe00001 < (int)(uVar2 ^ 0x80000000));
    auVar6._12_4_ = -(uint)(-0x70000001 < (int)(uVar2 ^ 0x80000000));
    iVar3 = movmskps(uVar2,auVar6);
    uVar1 = uVar1 + ((uint)(0x4332322132212110 >> ((byte)(iVar3 << 2) & 0x3f)) & 7);
  }
  return (ulong)uVar1;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}